

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtPubkeyListData
              (void *handle,void *pubkey_list_handle,uint32_t index,char **pubkey,char **pubkey_hex)

{
  undefined8 uVar1;
  KeyData *this;
  KeyData *pKVar2;
  undefined8 *in_RCX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  Pubkey pubkey_obj;
  ExtPubkey extkey;
  value_type key;
  CfdCapiPsbtPubkeyListHandle *list_handle;
  char *work_pubkey_hex;
  char *work_pubkey;
  int result;
  size_type in_stack_fffffffffffffbb8;
  KeyData *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffbe0;
  KeyData *in_stack_fffffffffffffbf8;
  allocator *paVar3;
  string *in_stack_fffffffffffffc20;
  string local_3b8;
  string local_398;
  Pubkey local_378;
  ByteData local_360;
  string local_348 [16];
  undefined8 in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  string local_328;
  ExtPubkey local_308;
  KeyData local_298;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  long local_88;
  allocator local_79;
  string local_78 [48];
  char *local_48;
  char *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_28;
  uint local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"PsbtPubkeyList",&local_79);
  cfd::capi::CheckBuffer((void *)in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_88 = local_18;
  if (local_28 == (undefined8 *)0x0) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x728;
    local_a0.funcname = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::warn<>(&local_a0,"pubkey is null.");
    local_c2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. pubkey is null.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_c2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 0x18) == 0) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x72e;
    local_e0.funcname = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::warn<>(&local_e0,"key_list is null.");
    local_102 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to handle statement. key_list is null.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_102 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = (KeyData *)(ulong)local_1c;
  pKVar2 = (KeyData *)
           std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::size
                     (*(vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> **)
                       (local_18 + 0x18));
  if (pKVar2 <= this) {
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x734;
    local_120.funcname = "CfdGetPsbtPubkeyListData";
    cfd::core::logger::warn<>(&local_120,"out of range error.");
    local_142 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar3 = &local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"Failed to out of range.",paVar3);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffbe0,error_code,in_stack_fffffffffffffbd0);
    local_142 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::at
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  cfd::core::KeyData::KeyData(this,in_stack_fffffffffffffbf8);
  if ((*(byte *)(local_88 + 0x11) & 1) == 0) {
    cfd::core::KeyData::GetPubkey(&local_378,&local_298);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_398,&local_378);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffffc20);
    std::__cxx11::string::~string((string *)&local_398);
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3b8,&local_378);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffc20);
      std::__cxx11::string::~string((string *)&local_3b8);
    }
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5fada0);
  }
  else {
    cfd::core::KeyData::GetExtPubkey(&local_308,&local_298);
    cfd::core::ExtPubkey::ToString_abi_cxx11_(&local_328,&local_308);
    local_40 = cfd::capi::CreateString(in_stack_fffffffffffffc20);
    std::__cxx11::string::~string((string *)&local_328);
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::ExtPubkey::GetData(&local_360,&local_308);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_348,&local_360);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffc20);
      std::__cxx11::string::~string(local_348);
      cfd::core::ByteData::~ByteData((ByteData *)0x5fabc4);
    }
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffbc0);
  }
  *local_28 = local_40;
  if (local_30 != (undefined8 *)0x0) {
    *local_30 = local_48;
  }
  local_4 = 0;
  cfd::core::KeyData::~KeyData(in_stack_fffffffffffffbc0);
  return local_4;
}

Assistant:

int CfdGetPsbtPubkeyListData(
    void* handle, void* pubkey_list_handle, uint32_t index, char** pubkey,
    char** pubkey_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_pubkey_hex = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(pubkey_list_handle, kPrefixPsbtPubkeyList);
    CfdCapiPsbtPubkeyListHandle* list_handle =
        static_cast<CfdCapiPsbtPubkeyListHandle*>(pubkey_list_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (list_handle->key_list == nullptr) {
      warn(CFD_LOG_SOURCE, "key_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. key_list is null.");
    }
    if (index >= list_handle->key_list->size()) {
      warn(CFD_LOG_SOURCE, "out of range error.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError, "Failed to out of range.");
    }

    auto key = list_handle->key_list->at(index);
    if (list_handle->has_xpub_list) {
      auto extkey = key.GetExtPubkey();
      work_pubkey = CreateString(extkey.ToString());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(extkey.GetData().GetHex());
      }
    } else {
      auto pubkey_obj = key.GetPubkey();
      work_pubkey = CreateString(pubkey_obj.GetHex());
      if (pubkey_hex != nullptr) {
        work_pubkey_hex = CreateString(pubkey_obj.GetHex());
      }
    }

    *pubkey = work_pubkey;
    if (pubkey_hex != nullptr) *pubkey_hex = work_pubkey_hex;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_pubkey_hex);
  return result;
}